

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

void __thiscall ProgramResult::getFromExecution(ProgramResult *this,string *command)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  undefined1 local_518 [8];
  char buffer [1024];
  Timer timer;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&timer.total,"",(allocator<char> *)local_518);
  wasm::Timer::Timer((Timer *)(buffer + 0x3f8),(string *)&timer.total);
  std::__cxx11::string::~string((string *)&timer.total);
  timer.name.field_2._8_8_ = std::chrono::_V2::steady_clock::now();
  std::__cxx11::to_string(&local_48,timeout);
  std::operator+(&local_68,"timeout ",&local_48);
  std::operator+(&local_88,&local_68,"s ");
  std::operator+(&local_a8,&local_88,command);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518,
                 &local_a8," > /dev/null 2> /dev/null");
  iVar1 = system((char *)local_518);
  this->code = iVar1;
  std::__cxx11::string::~string((string *)local_518);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::to_string(&local_c8,timeout);
  std::operator+(&local_48,"timeout ",&local_c8);
  std::operator+(&local_68,&local_48,"s ");
  std::operator+(&local_88,&local_68,command);
  std::operator+(&local_a8,&local_88," 2> /dev/null");
  __stream = popen(local_a8._M_dataplus._M_p,"r");
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_c8);
  while( true ) {
    pcVar2 = fgets(local_518,0x400,__stream);
    if (pcVar2 == (char *)0x0) break;
    std::__cxx11::string::append((char *)&this->output);
  }
  pclose(__stream);
  wasm::Timer::stop((Timer *)(buffer + 0x3f8));
  this->time = (double)timer.startTime.__d.__r * 0.5;
  std::__cxx11::string::~string((string *)(buffer + 0x3f8));
  return;
}

Assistant:

void getFromExecution(std::string command) {
    Timer timer;
    timer.start();
    // do this using just core stdio.h and stdlib.h, for portability
    // sadly this requires two invokes
    code = system(("timeout " + std::to_string(timeout) + "s " + command +
                   " > /dev/null 2> /dev/null")
                    .c_str());
    const int MAX_BUFFER = 1024;
    char buffer[MAX_BUFFER];
    FILE* stream = popen(
      ("timeout " + std::to_string(timeout) + "s " + command + " 2> /dev/null")
        .c_str(),
      "r");
    while (fgets(buffer, MAX_BUFFER, stream) != NULL) {
      output.append(buffer);
    }
    pclose(stream);
    timer.stop();
    time = timer.getTotal() / 2;
  }